

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

void falkhash_test_cxx(void *input,int len,uint32_t seed,void *out)

{
  uint64_t hash [2];
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  if (len == 0) {
    *(undefined4 *)out = 0;
  }
  else {
    falkhash_test(input,(long)len,seed,&local_28);
    *(undefined8 *)out = local_28;
  }
  return;
}

Assistant:

void
falkhash_test_cxx(const void *input, int len, uint32_t seed, void *out)
{
  uint64_t hash[2] = {0ULL, 0ULL};
  if (!len) {
    *(uint32_t *) out = 0;
    return;
  }
  // objsize: 0-0x108: 264
  falkhash_test((uint8_t *)input, (uint64_t)len, seed, hash);
  *(uint64_t *) out = hash[0];
}